

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdHist.c
# Opt level: O1

void Cmd_HistoryAddCommand(Abc_Frame_t *p,char *command)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *__s1;
  Vec_Ptr_t *p_00;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  void **ppvVar7;
  char Buffer [32768];
  undefined8 local_8040;
  short local_8038;
  char cStack_8036;
  undefined1 uStack_8035;
  char local_8034;
  undefined2 uStack_8033;
  
  if (p->fBatchMode != 0) {
    return;
  }
  sVar3 = strlen(command);
  strcpy((char *)&local_8038,command);
  if ((0 < (int)sVar3) &&
     (uVar6 = (ulong)((int)sVar3 - 1), *(char *)((long)&local_8038 + uVar6) == '\n')) {
    *(undefined1 *)((long)&local_8038 + uVar6) = 0;
  }
  sVar3 = strlen((char *)&local_8038);
  if ((((((3 < sVar3) && (cStack_8036 != 't' || local_8038 != 0x6573)) &&
        (iVar2 = CONCAT13(uStack_8035,CONCAT12(cStack_8036,local_8038)),
        local_8034 != 't' || iVar2 != 0x65736e75)) &&
       ((iVar2 != 0x656d6974 && (iVar2 != 0x74697571)))) &&
      ((local_8034 != 's' || CONCAT13(uStack_8035,CONCAT12(cStack_8036,local_8038)) != 0x61696c61 &&
       ((CONCAT22(uStack_8033,CONCAT11(local_8034,uStack_8035)) != 0x79726f74 ||
         CONCAT13(uStack_8035,CONCAT12(cStack_8036,local_8038)) != 0x74736968 &&
        (cStack_8036 != ' ' || local_8038 != 0x6968)))))) &&
     ((cStack_8036 != '\0' || local_8038 != 0x6968 &&
      (*(char *)((long)&local_8038 + (sVar3 - 1)) != '?')))) {
    p_00 = p->aHistory;
    uVar1 = p_00->nSize;
    uVar4 = 10;
    if (10 < (int)uVar1) {
      uVar4 = uVar1;
    }
    uVar4 = uVar4 - 10;
    if ((int)uVar4 < (int)uVar1) {
      ppvVar7 = p_00->pArray + uVar4;
      local_8040 = p_00;
      do {
        __s1 = (char *)*ppvVar7;
        iVar2 = strcmp(__s1,(char *)&local_8038);
        p_00 = local_8040;
        uVar5 = uVar4;
        if (iVar2 == 0) break;
        uVar4 = uVar4 + 1;
        ppvVar7 = ppvVar7 + 1;
        uVar5 = uVar1;
      } while (uVar1 != uVar4);
    }
    else {
      __s1 = (char *)0x0;
      uVar5 = uVar4;
    }
    if (uVar5 == uVar1) {
      __s1 = Extra_UtilStrsav((char *)&local_8038);
    }
    else {
      Vec_PtrRemove(p_00,__s1);
      p_00 = p->aHistory;
    }
    Vec_PtrPush(p_00,__s1);
  }
  return;
}

Assistant:

void Cmd_HistoryAddCommand(    Abc_Frame_t * p, const char * command )
{
    int nLastLooked =   10;  // do not add history if the same entry appears among the last entries
    int nLastSaved  = 1000;  // when saving a file, save no more than this number of last entries
    char Buffer[ABC_MAX_STR];
    int Len;
    if ( p->fBatchMode )
        return;
    Len = strlen(command);
    strcpy( Buffer, command );
    if ( Len > 0 && Buffer[Len-1] == '\n' )
        Buffer[Len-1] = 0;
    if ( strlen(Buffer) > 3 &&
         strncmp(Buffer,"set",3) && 
         strncmp(Buffer,"unset",5) && 
         strncmp(Buffer,"time",4) && 
         strncmp(Buffer,"quit",4) && 
         strncmp(Buffer,"alias",5) && 
//         strncmp(Buffer,"source",6) && 
         strncmp(Buffer,"history",7) && strncmp(Buffer,"hi ", 3) && strcmp(Buffer,"hi") &&
         Buffer[strlen(Buffer)-1] != '?' )
    {
        char * pStr = NULL;
        int i, Start = Abc_MaxInt( 0, Vec_PtrSize(p->aHistory) - nLastLooked );
        // do not enter if the same command appears among nLastLooked commands
        Vec_PtrForEachEntryStart( char *, p->aHistory, pStr, i, Start )
            if ( !strcmp(pStr, Buffer) )
                break;
        if ( i == Vec_PtrSize(p->aHistory) )
        { // add new entry
            Vec_PtrPush( p->aHistory, Extra_UtilStrsav(Buffer) );
            Cmd_HistoryWrite( p, nLastSaved );
        }
        else
        { // put at the end
            Vec_PtrRemove( p->aHistory, pStr );
            Vec_PtrPush( p->aHistory, pStr );
        }
    }
}